

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void linenoisePrintKeyCodes(void)

{
  int iVar1;
  ssize_t sVar2;
  ushort **ppuVar3;
  uint local_18;
  char local_d;
  int nread;
  char c;
  char quit [4];
  
  printf(
        "Linenoise key codes debugging mode.\nPress keys to see scan codes. Type \'quit\' at any time to exit.\n"
        );
  iVar1 = enableRawMode(0);
  if (iVar1 != -1) {
    memset(&nread,0x20,4);
    while( true ) {
      do {
        local_d = '\0';
        sVar2 = read(0,&local_d,1);
      } while ((int)sVar2 < 1);
      nread = CONCAT13(local_d,(int3)((uint)nread >> 8));
      if (nread == 0x74697571) break;
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)local_d] & 0x4000) == 0) {
        local_18 = 0x3f;
      }
      else {
        local_18 = (uint)local_d;
      }
      printf("\'%c\' %02x (%d) (type quit to exit)\n",(ulong)local_18,(ulong)(uint)(int)local_d,
             (ulong)(uint)(int)local_d);
      printf("\r");
      fflush(_stdout);
    }
    disableRawMode(0);
  }
  return;
}

Assistant:

void linenoisePrintKeyCodes(void) {
    char quit[4];

    printf("Linenoise key codes debugging mode.\n"
            "Press keys to see scan codes. Type 'quit' at any time to exit.\n");
    if (enableRawMode(STDIN_FILENO) == -1) return;
    memset(quit,' ',4);
    while(1) {
        char c = 0;
        int nread;

        nread = read(STDIN_FILENO,&c,sizeof c);
        if (nread <= 0) continue;
        memmove(quit,quit+1,sizeof(quit)-1); /* shift string to left. */
        quit[sizeof(quit)-1] = c; /* Insert current char on the right. */
        if (memcmp(quit,"quit",sizeof(quit)) == 0) break;

        printf("'%c' %02x (%d) (type quit to exit)\n",
            isprint((int)c) ? c : '?', (int)c, (int)c);
        printf("\r"); /* Go left edge manually, we are in raw mode. */
        fflush(stdout);
    }
    disableRawMode(STDIN_FILENO);
}